

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ccb0f7::ResizeRealtimeTest::ResizeRealtimeTest(ResizeRealtimeTest *this)

{
  __tuple_element_t<3UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int>_> *p_Var1;
  __tuple_element_t<3UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int>_> *p_Var2;
  undefined8 *in_RDI;
  CodecFactory *in_stack_ffffffffffffffb8;
  EncoderTest *in_stack_ffffffffffffffc0;
  
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,_int,_int>::CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,_int,_int> *)in_stack_ffffffffffffffc0);
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  ::GetParam();
  std::get<0ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int>
            ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int> *)0x8dbcdc);
  libaom_test::EncoderTest::EncoderTest(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__ResizeRealtimeTest_01f85140;
  in_RDI[2] = &PTR__ResizeRealtimeTest_01f85198;
  in_RDI[3] = &PTR__ResizeRealtimeTest_01f851b8;
  std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>::
  vector((vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
          *)0x8dbd1e);
  p_Var1 = (__tuple_element_t<3UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int>_> *)
           ((long)in_RDI + 0x414);
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  ::GetParam();
  p_Var2 = std::get<3ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int> *)
                      0x8dbd44);
  *p_Var1 = *p_Var2;
  *(undefined1 *)((long)in_RDI + 0x42c) = 0;
  *(undefined1 *)((long)in_RDI + 0x42d) = 0;
  *(undefined1 *)((long)in_RDI + 0x42e) = 0;
  *(undefined1 *)((long)in_RDI + 0x42f) = 0;
  return;
}

Assistant:

ResizeRealtimeTest()
      : EncoderTest(GET_PARAM(0)), num_threads_(GET_PARAM(3)),
        set_scale_mode_(false), set_scale_mode2_(false),
        set_scale_mode3_(false), is_screen_(false) {}